

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O2

void av1_cyclic_refresh_set_golden_update(AV1_COMP *cpi)

{
  uint uVar1;
  int iVar2;
  AV1_PRIMARY *pAVar3;
  int iVar4;
  int iVar5;
  
  pAVar3 = cpi->ppi;
  uVar1 = cpi->cyclic_refresh->percent_refresh;
  if ((int)uVar1 < 1) {
    iVar4 = 0x50;
  }
  else {
    iVar4 = (int)(100 / (ulong)uVar1) *
            *(int *)(&DAT_0045b070 + (long)(cpi->sf).rt_sf.gf_length_lvl * 4);
    if (0x9f < iVar4) {
      iVar4 = 0xa0;
    }
  }
  (pAVar3->p_rc).baseline_gf_interval = iVar4;
  iVar2 = (cpi->rc).avg_frame_low_motion;
  iVar5 = 0x10;
  if (0x27 < iVar2) {
    iVar5 = iVar4;
  }
  if (iVar2 == 0) {
    iVar5 = iVar4;
  }
  (pAVar3->p_rc).baseline_gf_interval = iVar5;
  return;
}

Assistant:

void av1_cyclic_refresh_set_golden_update(AV1_COMP *const cpi) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  // Set minimum gf_interval for GF update to a multiple of the refresh period,
  // with some max limit. Depending on past encoding stats, GF flag may be
  // reset and update may not occur until next baseline_gf_interval.
  const int gf_length_mult[2] = { 8, 4 };
  if (cr->percent_refresh > 0)
    p_rc->baseline_gf_interval =
        AOMMIN(gf_length_mult[cpi->sf.rt_sf.gf_length_lvl] *
                   (100 / cr->percent_refresh),
               MAX_GF_INTERVAL_RT);
  else
    p_rc->baseline_gf_interval = FIXED_GF_INTERVAL_RT;
  if (rc->avg_frame_low_motion && rc->avg_frame_low_motion < 40)
    p_rc->baseline_gf_interval = 16;
}